

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpunit.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 local_e8;
  yabmp *l_reader_5;
  void *l_row;
  yabmp *l_reader_4;
  yabmp_info *l_info_1;
  yabmp_color *l_lut;
  size_t l_v8;
  yabmp_uint8 *l_data;
  yabmp_q16d16 gb;
  yabmp_q16d16 gg;
  yabmp_q16d16 gr;
  yabmp_cie_xyz b;
  yabmp_cie_xyz g;
  yabmp_cie_xyz r;
  uint l_v7;
  uint l_v6;
  uint l_v5;
  uint l_v4;
  yabmp_uint32 l_v3;
  yabmp_uint32 l_v2;
  yabmp_uint32 l_v1;
  yabmp_uint32 l_v0;
  yabmp *l_reader_3;
  yabmp_info *l_info;
  yabmp *l_reader_2;
  yabmp *l_reader_1;
  yabmp *l_reader;
  yabmp_uint32 local_30;
  yabmp_uint32 patch2;
  yabmp_uint32 minor2;
  yabmp_uint32 major2;
  yabmp_uint32 patch;
  yabmp_uint32 minor;
  yabmp_uint32 major;
  int result;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  minor = 0;
  patch = 0;
  major2 = 0;
  minor2 = 0;
  patch2 = 1;
  local_30 = 1;
  l_reader._4_4_ = 1;
  _major = argv;
  argv_local._0_4_ = argc;
  yabmp_get_version(0,0);
  yabmp_get_version(&patch,&major2,&minor2);
  yabmp_get_version(&patch2,0);
  yabmp_get_version(0,&local_30);
  yabmp_get_version(0,0,(long)&l_reader + 4);
  minor = ((patch != patch2 || major2 != local_30) || minor2 != l_reader._4_4_) | minor;
  l_reader_1 = (yabmp *)0x0;
  iVar1 = yabmp_create_reader(&l_reader_1,0,print_error,print_warning,0,custom_malloc,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_create_reader(&l_reader_1,0,print_error,print_warning,0,0,custom_free);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_create_reader(0,0,print_error,print_warning,0,0,custom_free);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_create_reader(0,0,print_error,print_warning,0,0,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_create_reader(&l_reader_1,0,print_error,print_warning,0,custom_malloc,custom_free);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_create_reader(&l_reader_1,0,print_error,print_warning,0,custom_malloc,custom_free);
  minor = iVar1 != 3 | minor;
  yabmp_destroy_reader(&l_reader_1,0);
  l_reader_2 = (yabmp *)0x0;
  iVar1 = yabmp_create_reader(&l_reader_2,0,print_error,print_warning,0,0,0);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_set_input_stream(0,0,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_input_stream(l_reader_2,0,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_input_stream(l_reader_2,0,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_input_stream(l_reader_2,0,0,0,custom_close);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_input_stream(l_reader_2,0,custom_read);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_set_input_stream(l_reader_2,0,custom_read,custom_seek,custom_close);
  minor = iVar1 != 1 | minor;
  yabmp_destroy_reader(&l_reader_2,0);
  iVar1 = yabmp_create_reader(&l_reader_2,0,print_error,print_warning,0,0,0);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_set_input_file(0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_input_file(l_reader_2,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_input_file(l_reader_2,"dummy/directory/that/does/not/exist/file.txt");
  minor = iVar1 != 1 | minor;
  iVar1 = yabmp_set_input_memory(0,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_input_memory(l_reader_2,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_input_memory(l_reader_2,l_reader_2,0);
  minor = iVar1 != 0 | minor;
  yabmp_destroy_reader(&l_reader_2,0);
  l_info = (yabmp_info *)0x0;
  l_reader_3 = (yabmp *)0x0;
  iVar1 = yabmp_create_reader(&l_info,0,print_error,print_warning,0,0,0);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_create_info(0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_create_info(l_info,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_create_info(0,&l_reader_3);
  minor = iVar1 != 3 | minor;
  l_reader_3 = (yabmp *)l_info;
  iVar1 = yabmp_create_info(l_info,&l_reader_3);
  minor = iVar1 != 3 | minor;
  l_reader_3 = (yabmp *)0x0;
  iVar1 = yabmp_create_info(l_info,&l_reader_3);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_read_info(0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_read_info(l_info,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_read_info(0,l_reader_3);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_read_info(l_info,l_reader_3);
  minor = iVar1 != 1 | minor;
  iVar1 = yabmp_set_input_stream(l_info,0,custom_read);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_read_info(l_info,l_reader_3);
  minor = iVar1 != 1 | minor;
  yabmp_destroy_reader(&l_info,&l_reader_3);
  _l_v1 = 0;
  l_reader_4 = (yabmp *)&l_v8;
  iVar1 = yabmp_create_reader(&l_v1,0,print_error,print_warning,0,0,0);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_get_dimensions(0,l_reader_4,&l_v2);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_dimensions(_l_v1,0,&l_v2);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_dimensions(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_pixels_per_meter(0,l_reader_4,&l_v2);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_pixels_per_meter(_l_v1,0,&l_v2);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_pixels_per_meter(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bit_depth(0,l_reader_4,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bit_depth(_l_v1,0,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bit_depth(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_type(0,l_reader_4,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_type(_l_v1,0,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_type(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_compression_type(0,l_reader_4,&l_v2);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_compression_type(_l_v1,0,&l_v2);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_compression_type(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_scan_direction(0,l_reader_4,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_scan_direction(_l_v1,0,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_scan_direction(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bitfields(0,l_reader_4,&l_v2,&l_v3,&l_v4,&l_v5);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bitfields(_l_v1,0,&l_v2,&l_v3,&l_v4,&l_v5);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bitfields(_l_v1,l_reader_4,0,&l_v3,&l_v4,&l_v5);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bitfields(_l_v1,l_reader_4,&l_v2,0,&l_v4,&l_v5);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bitfields(_l_v1,l_reader_4,&l_v2,&l_v3,0,&l_v5);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bitfields(_l_v1,l_reader_4,&l_v2,&l_v3,&l_v4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bits(0,l_reader_4,&l_v6,&l_v7,&r.z,&r.y);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bits(_l_v1,0,&l_v6,&l_v7,&r.z,&r.y);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bits(_l_v1,l_reader_4,0,&l_v7,&r.z,&r.y);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bits(_l_v1,l_reader_4,&l_v6,0,&r.z,&r.y);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bits(_l_v1,l_reader_4,&l_v6,&l_v7,0,&r.y);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_bits(_l_v1,l_reader_4,&l_v6,&l_v7,&r.z,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_palette(0,l_reader_4,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_palette(_l_v1,0,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_palette(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_palette(_l_v1,l_reader_4,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_rowbytes(0,l_reader_4,&l_lut);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_rowbytes(_l_v1,0,&l_lut);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_rowbytes(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_type(0,l_reader_4,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_type(_l_v1,0,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_type(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_intent(0,l_reader_4,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_intent(_l_v1,0,&l_v6);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_intent(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_icc_data(0,l_reader_4,&l_v8);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_icc_data(_l_v1,0,&l_v8);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_icc_data(_l_v1,l_reader_4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_icc_data(_l_v1,l_reader_4,&l_v8);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_calibration
                    (0,l_reader_4,&g.y,&b.y,&gg,&gb,(long)&l_data + 4,&l_data);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_calibration(_l_v1,0,&g.y,&b.y,&gg,&gb,(long)&l_data + 4,&l_data);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_calibration
                    (_l_v1,l_reader_4,0,&b.y,&gg,&gb,(long)&l_data + 4,&l_data);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_calibration
                    (_l_v1,l_reader_4,&g.y,0,&gg,&gb,(long)&l_data + 4,&l_data);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_calibration
                    (_l_v1,l_reader_4,&g.y,&b.y,0,&gb,(long)&l_data + 4,&l_data);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_calibration
                    (_l_v1,l_reader_4,&g.y,&b.y,&gg,0,(long)&l_data + 4,&l_data);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_calibration(_l_v1,l_reader_4,&g.y,&b.y,&gg,&gb,0,&l_data);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_get_color_profile_calibration
                    (_l_v1,l_reader_4,&g.y,&b.y,&gg,&gb,(long)&l_data + 4,0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_read_update_info(_l_v1,0);
  minor = iVar1 != 3 | minor;
  yabmp_destroy_reader(&l_v1,0);
  l_row = (void *)0x0;
  l_reader_5 = (yabmp *)0x1;
  iVar1 = yabmp_create_reader(&l_row,0,print_error,print_warning,0,0,0);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_read_row(l_row,l_reader_5,0);
  minor = iVar1 != 1 | minor;
  iVar1 = yabmp_read_row(0,l_reader_5);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_read_row(l_row,0);
  minor = iVar1 != 3 | minor;
  yabmp_destroy_reader(&l_row,0);
  local_e8 = 0;
  iVar1 = yabmp_create_reader(&local_e8,0,print_error,print_warning,0,0,0);
  minor = iVar1 != 0 | minor;
  iVar1 = yabmp_set_invert_scan_direction(0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_expand_to_bgrx(0);
  minor = iVar1 != 3 | minor;
  iVar1 = yabmp_set_expand_to_grayscale(0);
  minor = iVar1 != 3 | minor;
  yabmp_destroy_reader(&local_e8,0);
  return minor;
}

Assistant:

int main(int argc, char* argv[])
{
	int result = EXIT_SUCCESS;
	
	/* test version */
	{
		yabmp_uint32 major  = 0U, minor  = 0U, patch  = 0U;
		yabmp_uint32 major2 = 1U, minor2 = 1U, patch2 = 1U;
		
		yabmp_get_version(NULL,    NULL,    NULL); /* check this doesn't crash */
		yabmp_get_version(&major,  &minor,  &patch);
		yabmp_get_version(&major2, NULL,    NULL);
		yabmp_get_version(NULL,    &minor2, NULL);
		yabmp_get_version(NULL,    NULL,    &patch2);
		
		result |= (((major^major2) | (minor^minor2) | (patch^patch2)) == 0U) ? EXIT_SUCCESS : EXIT_FAILURE;
	}
	
	/* test args error for yabmp_create_reader */
	{
		yabmp* l_reader = NULL;
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, custom_malloc, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, custom_free) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;

		result |= (yabmp_create_reader(NULL, NULL, print_error, print_warning, NULL, NULL, custom_free) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;

		result |= (yabmp_create_reader(NULL, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;

		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, custom_malloc, custom_free) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;

		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, custom_malloc, custom_free) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;

		yabmp_destroy_reader(&l_reader, NULL);
	}
	
	/* test args error for yabmp_set_input_stream */
	{
		yabmp* l_reader = NULL;
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_set_input_stream(NULL, NULL, NULL, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, NULL, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, NULL, custom_seek, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, NULL, NULL, custom_close) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, custom_seek, custom_close) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_file(NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_file(l_reader, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_file(l_reader, "dummy/directory/that/does/not/exist/file.txt") == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_set_input_memory(NULL, NULL, 0U) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_memory(l_reader, NULL, 0U) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_memory(l_reader, l_reader, 0U) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
		
	}
	
	/* test args error for yabmp_read_info */
	{
		yabmp* l_reader = NULL;
		yabmp_info* l_info = NULL;
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_create_info(NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_create_info(l_reader, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_create_info(NULL, &l_info) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		l_info = (yabmp_info*)l_reader;
		result |= (yabmp_create_info(l_reader, &l_info) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		l_info = NULL;
		result |= (yabmp_create_info(l_reader, &l_info) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		
		result |= (yabmp_read_info(NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(l_reader, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(NULL, l_info) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(l_reader, l_info) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(l_reader, l_info) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, &l_info);
	}
	
	/* test args error for yabmp_get_* (yabmp_info.c) */
	{
		yabmp* l_reader = NULL;
		yabmp_uint32 l_v0, l_v1, l_v2, l_v3;
		unsigned int l_v4, l_v5, l_v6, l_v7;
		yabmp_cie_xyz r, g, b;
		yabmp_q16d16 gr, gg, gb;
		yabmp_uint8 const* l_data;
		size_t l_v8;
		yabmp_color const *l_lut;
		yabmp_info* l_info = (yabmp_info*)&l_data;
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		/*
		TODO test before readinfo, shall fail
		result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_info(l_reader) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		*/
		
		result |= (yabmp_get_dimensions(NULL, l_info, &l_v0, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_dimensions(l_reader, NULL, &l_v0, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_dimensions(l_reader, l_info, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_pixels_per_meter(NULL, l_info, &l_v0, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_pixels_per_meter(l_reader, NULL, &l_v0, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_pixels_per_meter(l_reader, l_info, NULL, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_bit_depth(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bit_depth(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bit_depth(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_type(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_type(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_type(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_compression_type(NULL, l_info, &l_v0) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_compression_type(l_reader, NULL, &l_v0) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_compression_type(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_scan_direction(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_scan_direction(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_scan_direction(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		
		result |= (yabmp_get_bitfields(NULL, l_info, &l_v0, &l_v1, &l_v2, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, NULL, &l_v0, &l_v1, &l_v2, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, l_info, NULL, &l_v1, &l_v2, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, l_info, &l_v0, NULL, &l_v2, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, l_info, &l_v0, &l_v1, NULL, &l_v3) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bitfields(l_reader, l_info, &l_v0, &l_v1, &l_v2, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_bits(NULL, l_info, &l_v4, &l_v5, &l_v6, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, NULL, &l_v4, &l_v5, &l_v6, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, l_info, NULL, &l_v5, &l_v6, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, l_info, &l_v4, NULL, &l_v6, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, l_info, &l_v4, &l_v5, NULL, &l_v7) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_bits(l_reader, l_info, &l_v4, &l_v5, &l_v6, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_palette(NULL, l_info, &l_v4, &l_lut) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_palette(l_reader, NULL, &l_v4, &l_lut) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_palette(l_reader, l_info, NULL, &l_lut) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_palette(l_reader, l_info, &l_v4, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_rowbytes(NULL, l_info, &l_v8) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_rowbytes(l_reader, NULL, &l_v8) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_rowbytes(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_profile_type(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_type(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_type(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_profile_intent(NULL, l_info, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_intent(l_reader, NULL, &l_v4) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_intent(l_reader, l_info, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_profile_icc_data(NULL, l_info, &l_data, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_icc_data(l_reader, NULL, &l_data, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_icc_data(l_reader, l_info, NULL, &l_v1) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_icc_data(l_reader, l_info, &l_data, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_get_color_profile_calibration(NULL, l_info, &r, &g, &b, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, NULL, &r, &g, &b, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, NULL, &g, &b, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, NULL, &b, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, &g, NULL, &gr, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, &g, &b, NULL, &gg, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, &g, &b, &gr, NULL, &gb) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_get_color_profile_calibration(l_reader, l_info, &r, &g, &b, &gr, &gg, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_read_update_info(l_reader, NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
	}
	
	/* test args error for yabmp_read_row */
	{
		yabmp* l_reader = NULL;
		void* l_row = (void*)1U;
		
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		result |= (yabmp_read_row(l_reader, l_row, 0U) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		/*
		 result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		 result |= (yabmp_read_info(l_reader) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		 */
		
		result |= (yabmp_read_row(NULL, l_row, 0U) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_read_row(l_reader, NULL, 0U) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
	}
	
	/* test args error for yabmp_set_* transforms */
	{
		yabmp* l_reader = NULL;
		
		result |= (yabmp_create_reader(&l_reader, NULL, print_error, print_warning, NULL, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		/*
		 TODO test before readinfo, shall fail
		 result |= (yabmp_set_input_stream(l_reader, NULL, custom_read, NULL, NULL) == YABMP_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
		 result |= (yabmp_read_info(l_reader) == YABMP_ERR_UNKNOW) ? EXIT_SUCCESS : EXIT_FAILURE;
		 */
		
		result |= (yabmp_set_invert_scan_direction(NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_expand_to_bgrx(NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		result |= (yabmp_set_expand_to_grayscale(NULL) == YABMP_ERR_INVALID_ARGS) ? EXIT_SUCCESS : EXIT_FAILURE;
		
		yabmp_destroy_reader(&l_reader, NULL);
	}
	
	return result;
	
}